

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O2

TriangleMesh *
pbrt::LoopSubdivide(Transform *renderFromObject,bool reverseOrientation,int nLevels,
                   span<const_int> vertexIndices,span<const_pbrt::Point3<float>_> p,Allocator alloc)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  mapped_type pSVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  pointer ppSVar6;
  int iVar7;
  uint uVar8;
  size_t i;
  ulong uVar9;
  iterator iVar10;
  SDFace *pSVar11;
  SDVertex *pSVar12;
  SDFace *pSVar13;
  mapped_type *ppSVar14;
  SDVertex *pSVar15;
  pointer ppSVar16;
  long lVar17;
  SDFace *pSVar18;
  mapped_type *pmVar19;
  TriangleMesh *pTVar20;
  int *piVar21;
  size_t i_1;
  pointer ppSVar22;
  long lVar23;
  size_t i_3;
  size_t sVar24;
  pointer piVar25;
  int v0;
  long lVar26;
  ulong uVar27;
  pointer ppSVar28;
  long lVar29;
  bool bVar30;
  Float beta;
  float fVar31;
  float __x;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined8 uVar59;
  undefined1 auVar36 [16];
  float extraout_XMM0_Dd;
  undefined1 auVar37 [16];
  undefined8 uVar60;
  undefined1 auVar38 [16];
  float extraout_XMM0_Dc;
  undefined1 auVar61 [56];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar62 [60];
  undefined1 in_register_00001304 [12];
  Point3f PVar63;
  Point3<float> PVar64;
  Vector3<float> VVar65;
  Point3<float> PVar66;
  Point3<float> PVar67;
  Point3<float> PVar68;
  Point3<float> PVar69;
  bool reverseOrientation_local;
  vector<int,_std::allocator<int>_> verts_1;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pRing;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> v;
  SDVertex *vert;
  pointer pVStack_230;
  pointer local_228;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> Ns;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> f;
  map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
  edgeVerts;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> pLimit;
  Allocator vertexFaceAllocator;
  unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_> fs;
  unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_> verts;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> faces;
  vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> vertices;
  monotonic_buffer_resource resource;
  Allocator alloc_local;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  _Vector_base<int,_std::allocator<int>_> local_98;
  _Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_78;
  set<pbrt::SDEdge,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_> edges;
  undefined1 extraout_var [60];
  
  piVar21 = vertexIndices.ptr;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  reverseOrientation_local = reverseOrientation;
  alloc_local = alloc;
  std::make_unique<pbrt::SDVertex[]>((size_t)&verts);
  lVar26 = 0;
  sVar24 = p.n;
  while (bVar30 = sVar24 != 0, sVar24 = sVar24 - 1, bVar30) {
    resource.upstreamResource =
         (memory_resource *)
         CONCAT44(resource.upstreamResource._4_4_,((p.ptr)->super_Tuple3<pbrt::Point3,_float>).z);
    uVar60 = *(undefined8 *)&(p.ptr)->super_Tuple3<pbrt::Point3,_float>;
    resource.blockSize = 0;
    resource.currentBlock.ptr = (void *)0x0;
    resource.currentBlock.size = resource.currentBlock.size & 0xffffffffffff0000;
    resource.super_memory_resource._vptr_memory_resource =
         (_func_int **)
         ((long)verts._M_t.
                super___uniq_ptr_impl<pbrt::SDVertex,_std::default_delete<pbrt::SDVertex[]>_>._M_t.
                super__Tuple_impl<0UL,_pbrt::SDVertex_*,_std::default_delete<pbrt::SDVertex[]>_>.
                super__Head_base<0UL,_pbrt::SDVertex_*,_false>._M_head_impl + lVar26);
    *(undefined2 *)
     ((long)verts._M_t.super___uniq_ptr_impl<pbrt::SDVertex,_std::default_delete<pbrt::SDVertex[]>_>
            ._M_t.super__Tuple_impl<0UL,_pbrt::SDVertex_*,_std::default_delete<pbrt::SDVertex[]>_>.
            super__Head_base<0UL,_pbrt::SDVertex_*,_false>._M_head_impl + 0x20 + lVar26) = 0;
    puVar1 = (undefined8 *)
             ((long)verts._M_t.
                    super___uniq_ptr_impl<pbrt::SDVertex,_std::default_delete<pbrt::SDVertex[]>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_pbrt::SDVertex_*,_std::default_delete<pbrt::SDVertex[]>_>
                    .super__Head_base<0UL,_pbrt::SDVertex_*,_false>._M_head_impl + lVar26);
    *puVar1 = uVar60;
    puVar1[1] = resource.upstreamResource;
    puVar1[2] = 0;
    puVar1[3] = 0;
    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
    std::vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>>::emplace_back<pbrt::SDVertex*>
              ((vector<pbrt::SDVertex*,std::allocator<pbrt::SDVertex*>> *)&vertices,
               (SDVertex **)&resource);
    p.ptr = p.ptr + 1;
    lVar26 = lVar26 + 0x28;
  }
  uVar9 = vertexIndices.n / 3;
  std::make_unique<pbrt::SDFace[]>((size_t)&fs);
  lVar26 = 0;
  uVar27 = uVar9;
  while (bVar30 = uVar27 != 0, uVar27 = uVar27 - 1, bVar30) {
    resource.super_memory_resource._vptr_memory_resource =
         (_func_int **)
         ((long)fs._M_t.super___uniq_ptr_impl<pbrt::SDFace,_std::default_delete<pbrt::SDFace[]>_>.
                _M_t.super__Tuple_impl<0UL,_pbrt::SDFace_*,_std::default_delete<pbrt::SDFace[]>_>.
                super__Head_base<0UL,_pbrt::SDFace_*,_false>._M_head_impl + lVar26);
    std::vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>>::emplace_back<pbrt::SDFace*>
              ((vector<pbrt::SDFace*,std::allocator<pbrt::SDFace*>> *)&faces,(SDFace **)&resource);
    lVar26 = lVar26 + 0x50;
  }
  for (uVar27 = 0; uVar27 != uVar9; uVar27 = uVar27 + 1) {
    pSVar11 = faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27];
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar15 = vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                _M_impl.super__Vector_impl_data._M_start[piVar21[lVar26]];
      pSVar11->v[lVar26] = pSVar15;
      pSVar15->startFace = pSVar11;
    }
    piVar21 = piVar21 + 3;
  }
  p_Var2 = &edges._M_t._M_impl.super__Rb_tree_header;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  edges._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar27 = 0;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  edges._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; uVar27 != uVar9; uVar27 = uVar27 + 1) {
    pSVar11 = faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27];
    lVar26 = 0;
    while (lVar26 != 3) {
      lVar23 = lVar26 + 1;
      resource.upstreamResource = (memory_resource *)pSVar11->v[lVar26];
      lVar17 = 0;
      if (lVar26 != 2) {
        lVar17 = lVar23;
      }
      pSVar15 = pSVar11->v[lVar17];
      resource.super_memory_resource._vptr_memory_resource = (_func_int **)resource.upstreamResource
      ;
      if (pSVar15 < resource.upstreamResource) {
        resource.super_memory_resource._vptr_memory_resource = (_func_int **)pSVar15;
      }
      if (resource.upstreamResource < pSVar15) {
        resource.upstreamResource = (memory_resource *)pSVar15;
      }
      resource.blockSize = 0;
      resource.currentBlock.ptr = (void *)0x0;
      resource.currentBlock.size = CONCAT44(resource.currentBlock.size._4_4_,0xffffffff);
      iVar10 = std::
               _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
               ::find((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                       *)&edges,(key_type *)&resource);
      auVar34 = in_ZMM1._0_16_;
      if ((_Rb_tree_header *)iVar10._M_node == p_Var2) {
        resource.currentBlock.size = CONCAT44(resource.currentBlock.size._4_4_,(int)lVar26);
        resource.blockSize = (size_t)pSVar11;
        std::
        _Rb_tree<pbrt::SDEdge,pbrt::SDEdge,std::_Identity<pbrt::SDEdge>,std::less<pbrt::SDEdge>,std::allocator<pbrt::SDEdge>>
        ::_M_insert_unique<pbrt::SDEdge_const&>
                  ((_Rb_tree<pbrt::SDEdge,pbrt::SDEdge,std::_Identity<pbrt::SDEdge>,std::less<pbrt::SDEdge>,std::allocator<pbrt::SDEdge>>
                    *)&edges,(SDEdge *)&resource);
        lVar26 = lVar23;
      }
      else {
        iVar10 = std::
                 _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                 ::find((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                         *)&edges,(key_type *)&resource);
        resource.super_memory_resource._vptr_memory_resource = *(_func_int ***)(iVar10._M_node + 1);
        resource.upstreamResource = (memory_resource *)iVar10._M_node[1]._M_parent;
        resource.blockSize = (size_t)iVar10._M_node[1]._M_left;
        resource.currentBlock.ptr = iVar10._M_node[1]._M_right;
        resource.currentBlock.size =
             CONCAT44(resource.currentBlock.size._4_4_,iVar10._M_node[2]._M_color);
        ((SDFace *)resource.blockSize)->f[(int)iVar10._M_node[2]._M_color] = pSVar11;
        pSVar11->f[lVar26] = (SDFace *)resource.blockSize;
        in_ZMM1 = ZEXT1664(auVar34);
        std::
        _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
        ::erase((_Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
                 *)&edges,(key_type *)&resource);
        lVar26 = lVar23;
      }
    }
  }
  for (sVar24 = 0; sVar24 != p.n; sVar24 = sVar24 + 1) {
    pSVar15 = vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
              _M_impl.super__Vector_impl_data._M_start[sVar24];
    pSVar11 = pSVar15->startFace;
    do {
      pSVar11 = SDFace::nextFace(pSVar11,pSVar15);
      if (pSVar11 == (SDFace *)0x0) {
        pSVar15->boundary = true;
        goto LAB_002e0034;
      }
    } while (pSVar11 != pSVar15->startFace);
    pSVar15->boundary = false;
    iVar7 = SDVertex::valence(pSVar15);
    bVar30 = true;
    if (iVar7 != 6) {
      if ((pSVar15->boundary & 1U) != 0) {
LAB_002e0034:
        iVar7 = SDVertex::valence(pSVar15);
        bVar30 = true;
        if (iVar7 == 4) goto LAB_002e0045;
      }
      bVar30 = false;
    }
LAB_002e0045:
    pSVar15->regular = bVar30;
  }
  std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::vector(&f,&faces);
  std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::vector(&v,&vertices);
  resource.upstreamResource = pstd::pmr::get_default_resource();
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&resource.usedBlocks;
  resource.super_memory_resource._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_02db59b0;
  resource.blockSize = 0x40000;
  resource.currentBlock.ptr = (void *)0x0;
  resource.currentBlock.size = 0;
  resource.currentBlockPos = 0;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node._M_size = 0;
  uVar8 = 0;
  vertexFaceAllocator.memoryResource = &resource.super_memory_resource;
  resource.usedBlocks.
  super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       resource.usedBlocks.
       super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  for (; ppSVar4 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                   .super__Vector_impl_data._M_finish, uVar8 != (~(nLevels >> 0x1f) & nLevels);
      uVar8 = uVar8 + 1) {
    Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
    Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._0_16_ =
         pRing.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
         _M_impl.super__Vector_impl_data._0_16_;
    for (ppSVar22 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        ppSVar5 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        ppSVar16 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                   super__Vector_impl_data._M_start, ppSVar22 != ppSVar4; ppSVar22 = ppSVar22 + 1) {
      pSVar15 = *ppSVar22;
      pSVar12 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::SDVertex>
                          (&vertexFaceAllocator);
      pSVar15->child = pSVar12;
      pSVar12->regular = pSVar15->regular;
      pSVar12->boundary = pSVar15->boundary;
      std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::push_back
                ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)&pRing,
                 &pSVar15->child);
    }
    for (; ppSVar4 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish, ppSVar16 != ppSVar5;
        ppSVar16 = ppSVar16 + 1) {
      pSVar11 = *ppSVar16;
      for (lVar26 = 0; lVar26 != 0x20; lVar26 = lVar26 + 8) {
        pSVar13 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::SDFace>
                            (&vertexFaceAllocator);
        *(SDFace **)((long)pSVar11->children + lVar26) = pSVar13;
        std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::push_back
                  ((vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)&Ns,
                   (value_type *)((long)pSVar11->children + lVar26));
      }
    }
    ppSVar22 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    while (ppSVar5 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish, auVar62 = in_ZMM1._4_60_,
          ppSVar22 != ppSVar4) {
      pSVar15 = *ppSVar22;
      if (pSVar15->boundary == false) {
        if (pSVar15->regular == true) {
          auVar61 = (undefined1  [56])0x0;
          PVar63 = weightOneRing(pSVar15,0.0625);
          in_ZMM1._0_4_ = PVar63.super_Tuple3<pbrt::Point3,_float>.z;
          in_ZMM1._4_60_ = auVar62;
          auVar40._0_8_ = PVar63.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar40._8_56_ = auVar61;
          auVar34 = auVar40._0_16_;
        }
        else {
          iVar7 = SDVertex::valence(pSVar15);
          auVar62 = (undefined1  [60])0x0;
          auVar61 = (undefined1  [56])0x0;
          PVar63 = weightOneRing(pSVar15,(Float)((uint)(iVar7 == 3) * 0x3e400000 +
                                                (uint)(iVar7 != 3) *
                                                (int)(3.0 / ((float)iVar7 * 8.0))));
          in_ZMM1._0_4_ = PVar63.super_Tuple3<pbrt::Point3,_float>.z;
          in_ZMM1._4_60_ = auVar62;
          auVar53._0_8_ = PVar63.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar53._8_56_ = auVar61;
          auVar34 = auVar53._0_16_;
        }
      }
      else {
        auVar61 = (undefined1  [56])0x0;
        PVar63 = weightBoundary(pSVar15,0.125);
        in_ZMM1._0_4_ = PVar63.super_Tuple3<pbrt::Point3,_float>.z;
        in_ZMM1._4_60_ = auVar62;
        auVar39._0_8_ = PVar63.super_Tuple3<pbrt::Point3,_float>._0_8_;
        auVar39._8_56_ = auVar61;
        auVar34 = auVar39._0_16_;
      }
      pSVar15 = pSVar15->child;
      ppSVar22 = ppSVar22 + 1;
      uVar60 = vmovlps_avx(auVar34);
      (pSVar15->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar60;
      (pSVar15->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar60 >> 0x20);
      (pSVar15->p).super_Tuple3<pbrt::Point3,_float>.z = in_ZMM1._0_4_;
    }
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header;
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppSVar16 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppSVar4 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
                  super__Vector_impl_data._M_finish,
        ppSVar22 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl
                   .super__Vector_impl_data._M_start, ppSVar16 != ppSVar5; ppSVar16 = ppSVar16 + 1)
    {
      pSVar11 = *ppSVar16;
      for (lVar26 = 3; lVar26 != 6; lVar26 = lVar26 + 1) {
        pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = &pSVar11->v[lVar26 + -3]->p;
        register0x00001200 = (SDFace * [2])(ZEXT816(0) << 0x40);
        lVar23 = 0;
        if (lVar26 != 5) {
          lVar23 = lVar26 + -2;
        }
        pSVar15 = pSVar11->v[lVar23];
        pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (pSVar15 < pLimit.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = &pSVar15->p;
        }
        if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish < pSVar15) {
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = &pSVar15->p;
        }
        ppSVar14 = std::
                   map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                   ::operator[](&edgeVerts,(key_type *)&pLimit);
        auVar62 = in_ZMM1._4_60_;
        vert = *ppSVar14;
        if (vert == (mapped_type)0x0) {
          vert = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::SDVertex>
                           (&vertexFaceAllocator);
          std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::push_back
                    ((vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)&pRing,&vert);
          vert->regular = true;
          bVar30 = pSVar11->v[lVar26] == (SDVertex *)0x0;
          vert->boundary = bVar30;
          vert->startFace = pSVar11->children[3];
          if (bVar30) {
            auVar61 = (undefined1  [56])0x0;
            PVar64 = Tuple3<pbrt::Point3,float>::operator*
                               ((Tuple3<pbrt::Point3,float> *)
                                pLimit.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,0.5);
            auVar45._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar45._8_56_ = auVar61;
            uVar60 = vmovlps_avx(auVar45._0_16_);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar60;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar60 >> 0x20);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.z =
                 PVar64.super_Tuple3<pbrt::Point3,_float>.z;
            auVar61 = (undefined1  [56])0x0;
            PVar64 = Tuple3<pbrt::Point3,float>::operator*
                               ((Tuple3<pbrt::Point3,float> *)
                                pLimit.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,0.5);
            in_ZMM1._0_4_ = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
            in_ZMM1._4_60_ = auVar62;
            auVar46._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar46._8_56_ = auVar61;
            auVar34 = auVar46._0_16_;
          }
          else {
            auVar61 = (undefined1  [56])0x0;
            PVar64 = Tuple3<pbrt::Point3,float>::operator*
                               ((Tuple3<pbrt::Point3,float> *)
                                pLimit.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,0.375);
            auVar41._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar41._8_56_ = auVar61;
            uVar60 = vmovlps_avx(auVar41._0_16_);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar60;
            (vert->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar60 >> 0x20);
            (vert->p).super_Tuple3<pbrt::Point3,_float>.z =
                 PVar64.super_Tuple3<pbrt::Point3,_float>.z;
            auVar61 = (undefined1  [56])0x0;
            PVar64 = Tuple3<pbrt::Point3,float>::operator*
                               ((Tuple3<pbrt::Point3,float> *)
                                pLimit.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,0.375);
            verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
            auVar42._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar42._8_56_ = auVar61;
            verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)vmovlps_avx(auVar42._0_16_);
            Tuple3<pbrt::Point3,float>::operator+=
                      ((Tuple3<pbrt::Point3,float> *)vert,(Point3<float> *)&verts_1);
            pSVar15 = SDFace::otherVert(pSVar11,(SDVertex *)
                                                pLimit.
                                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start,
                                        (SDVertex *)
                                        pLimit.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
            auVar61 = (undefined1  [56])0x0;
            PVar64 = Tuple3<pbrt::Point3,float>::operator*
                               ((Tuple3<pbrt::Point3,float> *)pSVar15,0.125);
            verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
            auVar43._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar43._8_56_ = auVar61;
            verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)vmovlps_avx(auVar43._0_16_);
            Tuple3<pbrt::Point3,float>::operator+=
                      ((Tuple3<pbrt::Point3,float> *)vert,(Point3<float> *)&verts_1);
            pSVar15 = SDFace::otherVert((SDFace *)pSVar11->v[lVar26],
                                        (SDVertex *)
                                        pLimit.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (SDVertex *)
                                        pLimit.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish);
            auVar61 = (undefined1  [56])0x0;
            PVar64 = Tuple3<pbrt::Point3,float>::operator*
                               ((Tuple3<pbrt::Point3,float> *)pSVar15,0.125);
            in_ZMM1._0_4_ = PVar64.super_Tuple3<pbrt::Point3,_float>.z;
            in_ZMM1._4_60_ = auVar62;
            auVar44._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
            auVar44._8_56_ = auVar61;
            auVar34 = auVar44._0_16_;
          }
          verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)vmovlps_avx(auVar34);
          verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = in_ZMM1._0_4_;
          Tuple3<pbrt::Point3,float>::operator+=
                    ((Tuple3<pbrt::Point3,float> *)vert,(Point3<float> *)&verts_1);
          pSVar15 = vert;
          ppSVar14 = std::
                     map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                     ::operator[](&edgeVerts,(key_type *)&pLimit);
          *ppSVar14 = pSVar15;
        }
      }
    }
    for (; ppSVar5 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
        ppSVar16 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                   super__Vector_impl_data._M_start, ppSVar22 != ppSVar4; ppSVar22 = ppSVar22 + 1) {
      pSVar15 = *ppSVar22;
      iVar7 = SDFace::vnum(pSVar15->startFace,pSVar15);
      pSVar15->child->startFace = pSVar15->startFace->children[iVar7];
    }
    for (; ppSVar6 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
        ppSVar28 = f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                   super__Vector_impl_data._M_start, ppSVar16 != ppSVar5; ppSVar16 = ppSVar16 + 1) {
      pSVar11 = *ppSVar16;
      lVar26 = 0;
      while (lVar26 != 3) {
        lVar23 = lVar26 + 1;
        lVar17 = lVar23;
        if (lVar23 == 3) {
          lVar17 = 0;
        }
        pSVar11->children[3]->f[lVar26] = pSVar11->children[lVar17];
        pSVar11->children[lVar26]->f[lVar17] = pSVar11->children[3];
        pSVar18 = (SDFace *)0x0;
        pSVar13 = pSVar11->f[lVar26];
        if (pSVar13 != (SDFace *)0x0) {
          iVar7 = SDFace::vnum(pSVar13,pSVar11->v[lVar26]);
          pSVar18 = pSVar13->children[iVar7];
        }
        pSVar11->children[lVar26]->f[lVar26] = pSVar18;
        uVar27 = (ulong)((int)lVar26 - 1);
        if (lVar26 == 0) {
          uVar27 = 2;
        }
        pSVar13 = pSVar11->f[uVar27];
        if (pSVar13 == (SDFace *)0x0) {
          pSVar13 = (SDFace *)0x0;
        }
        else {
          iVar7 = SDFace::vnum(pSVar13,pSVar11->v[lVar26]);
          pSVar13 = pSVar13->children[iVar7];
        }
        pSVar11->children[lVar26]->f[uVar27] = pSVar13;
        lVar26 = lVar23;
      }
    }
    for (; ppSVar28 != ppSVar6; ppSVar28 = ppSVar28 + 1) {
      pSVar11 = *ppSVar28;
      lVar26 = 0;
      while (lVar26 != 3) {
        register0x00001200 = (SDFace * [2])(ZEXT816(0) << 0x40);
        lVar23 = 0;
        if (lVar26 != 2) {
          lVar23 = lVar26 + 1;
        }
        pSVar11->children[lVar26]->v[lVar26] = pSVar11->v[lVar26]->child;
        pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = &pSVar11->v[lVar26]->p;
        pSVar15 = pSVar11->v[lVar23];
        pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (pSVar15 < pLimit.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start = &pSVar15->p;
        }
        if (pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish < pSVar15) {
          pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = &pSVar15->p;
        }
        ppSVar14 = std::
                   map<pbrt::SDEdge,_pbrt::SDVertex_*,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
                   ::operator[](&edgeVerts,(key_type *)&pLimit);
        pSVar3 = *ppSVar14;
        pSVar11->children[lVar26]->v[lVar23] = pSVar3;
        pSVar11->children[lVar23]->v[lVar26] = pSVar3;
        pSVar11->children[3]->v[lVar26] = pSVar3;
        lVar26 = lVar26 + 1;
      }
    }
    std::vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::operator=
              (&f,(vector<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)&Ns);
    std::vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::operator=
              (&v,(vector<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)&pRing);
    std::
    _Rb_tree<pbrt::SDEdge,_std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>,_std::_Select1st<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>,_std::less<pbrt::SDEdge>,_std::allocator<std::pair<const_pbrt::SDEdge,_pbrt::SDVertex_*>_>_>
    ::~_Rb_tree(&edgeVerts._M_t);
    std::_Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::~_Vector_base
              ((_Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_> *)&pRing);
    std::_Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::~_Vector_base
              ((_Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_> *)&Ns);
  }
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (&pLimit,(long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&edgeVerts);
  lVar26 = 8;
  uVar27 = 0;
  while (auVar62 = in_ZMM1._4_60_,
        uVar27 < (ulong)((long)v.
                               super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)v.
                               super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pSVar15 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27];
    if (pSVar15->boundary == true) {
      auVar61 = (undefined1  [56])0x0;
      PVar63 = weightBoundary(pSVar15,0.2);
      in_ZMM1._0_4_ = PVar63.super_Tuple3<pbrt::Point3,_float>.z;
      in_ZMM1._4_60_ = auVar62;
      auVar47._0_8_ = PVar63.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar47._8_56_ = auVar61;
      auVar34 = auVar47._0_16_;
    }
    else {
      iVar7 = SDVertex::valence(pSVar15);
      beta = loopGamma(iVar7);
      auVar61 = extraout_var_00;
      PVar63 = weightOneRing(pSVar15,beta);
      in_ZMM1._0_4_ = PVar63.super_Tuple3<pbrt::Point3,_float>.z;
      in_ZMM1._4_60_ = auVar62;
      auVar48._0_8_ = PVar63.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar48._8_56_ = auVar61;
      auVar34 = auVar48._0_16_;
    }
    uVar27 = uVar27 + 1;
    uVar60 = vmovlps_avx(auVar34);
    *(undefined8 *)
     ((long)pLimit.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start + lVar26 + -8) = uVar60;
    *(int *)((long)&((pLimit.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->super_Tuple3<pbrt::Point3,_float>)
                    .x + lVar26) = in_ZMM1._0_4_;
    lVar26 = lVar26 + 0xc;
  }
  lVar26 = 0;
  for (uVar27 = 0;
      uVar9 = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3, uVar27 < uVar9;
      uVar27 = uVar27 + 1) {
    pSVar15 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27];
    (pSVar15->p).super_Tuple3<pbrt::Point3,_float>.z =
         *(float *)((long)&((pLimit.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Tuple3<pbrt::Point3,_float>).z + lVar26);
    uVar60 = *(undefined8 *)
              ((long)&((pLimit.
                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_Tuple3<pbrt::Point3,_float>).x + lVar26);
    lVar26 = lVar26 + 0xc;
    (pSVar15->p).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar60;
    (pSVar15->p).super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar60 >> 0x20);
  }
  Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  auVar49 = ZEXT1664((undefined1  [16])
                     Ns.
                     super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>
                     ._M_impl.super__Vector_impl_data._0_16_);
  Ns.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::reserve(&Ns,uVar9);
  edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  edgeVerts._M_t._M_impl._0_8_ = 0;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (&pRing,0x10,(value_type *)&edgeVerts,(allocator_type *)&verts_1);
  ppSVar4 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar22 = v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  do {
    auVar61 = auVar49._8_56_;
    if (ppSVar22 == ppSVar4) {
      lVar29 = (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
      std::vector<int,_std::allocator<int>_>::vector
                (&verts_1,lVar29 * 3,(allocator_type *)&edgeVerts);
      piVar25 = verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header;
      lVar23 = 0;
      lVar17 = (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (lVar26 = 0; lVar17 >> 3 != lVar26; lVar26 = lVar26 + 1) {
        pmVar19 = std::
                  map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                  ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                                *)&edgeVerts,
                               (key_type *)
                               ((long)v.
                                      super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar23));
        *pmVar19 = (mapped_type)lVar26;
        lVar23 = lVar23 + 8;
      }
      for (lVar26 = 0; lVar26 != lVar29; lVar26 = lVar26 + 1) {
        for (lVar23 = 0; lVar23 != 0x18; lVar23 = lVar23 + 8) {
          pmVar19 = std::
                    map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                    ::operator[]((map<pbrt::SDVertex_*,_int,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                                  *)&edgeVerts,
                                 (key_type *)
                                 ((long)f.
                                        super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar26]->v +
                                 lVar23));
          *piVar25 = *pmVar19;
          piVar25 = piVar25 + 1;
        }
      }
      local_228 = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vert = (SDVertex *)0x0;
      pVStack_230 = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pTVar20 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::TriangleMesh,pbrt::Transform_const&,bool&,std::vector<int,std::allocator<int>>&,std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>&,std::vector<pbrt::Vector3<float>,std::allocator<pbrt::Vector3<float>>>,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>,std::vector<int,std::allocator<int>>>
                          (&alloc_local,renderFromObject,&reverseOrientation_local,&verts_1,&pLimit,
                           (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)
                           &vert,&Ns,
                           (vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *)
                           &local_78,(vector<int,_std::allocator<int>_> *)&local_98);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
      std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
                (&local_78);
      std::_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~_Vector_base
                ((_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)&vert
                );
      std::
      _Rb_tree<pbrt::SDVertex_*,_std::pair<pbrt::SDVertex_*const,_int>,_std::_Select1st<std::pair<pbrt::SDVertex_*const,_int>_>,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
      ::~_Rb_tree((_Rb_tree<pbrt::SDVertex_*,_std::pair<pbrt::SDVertex_*const,_int>,_std::_Select1st<std::pair<pbrt::SDVertex_*const,_int>_>,_std::less<pbrt::SDVertex_*>,_std::allocator<std::pair<pbrt::SDVertex_*const,_int>_>_>
                   *)&edgeVerts);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&verts_1.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
                (&pRing.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
      std::_Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~_Vector_base
                (&Ns.
                  super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>);
      std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
                (&pLimit.
                  super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
      pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(&resource);
      std::_Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::~_Vector_base
                (&v.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>);
      std::_Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::~_Vector_base
                (&f.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>);
      std::
      _Rb_tree<pbrt::SDEdge,_pbrt::SDEdge,_std::_Identity<pbrt::SDEdge>,_std::less<pbrt::SDEdge>,_std::allocator<pbrt::SDEdge>_>
      ::~_Rb_tree(&edges._M_t);
      std::unique_ptr<pbrt::SDFace[],_std::default_delete<pbrt::SDFace[]>_>::~unique_ptr(&fs);
      std::unique_ptr<pbrt::SDVertex[],_std::default_delete<pbrt::SDVertex[]>_>::~unique_ptr(&verts)
      ;
      std::_Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>::~_Vector_base
                (&faces.super__Vector_base<pbrt::SDFace_*,_std::allocator<pbrt::SDFace_*>_>);
      std::_Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>::~_Vector_base
                (&vertices.super__Vector_base<pbrt::SDVertex_*,_std::allocator<pbrt::SDVertex_*>_>);
      return pTVar20;
    }
    pSVar15 = *ppSVar22;
    edgeVerts._M_t._M_impl._0_8_ = 0;
    verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
    _0_4_ = 0.0;
    uVar8 = SDVertex::valence(pSVar15);
    if ((int)(((long)pRing.
                     super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)pRing.
                    super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0xc) < (int)uVar8) {
      std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::resize
                (&pRing,(long)(int)uVar8);
    }
    SDVertex::oneRing(pSVar15,pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    auVar62 = in_ZMM1._4_60_;
    if (pSVar15->boundary == false) {
      auVar53 = ZEXT1664(CONCAT124(in_register_00001304,(float)(int)uVar8));
      lVar26 = 8;
      uVar27 = 0;
      while (auVar61 = auVar53._8_56_, (~((int)uVar8 >> 0x1f) & uVar8) != uVar27) {
        fVar33 = ((float)(int)uVar27 * 6.2831855) / (float)(int)uVar8;
        fVar31 = cosf(fVar33);
        uVar60 = *(undefined8 *)
                  ((long)pRing.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8);
        auVar34._0_4_ = fVar31 * (float)uVar60 + edgeVerts._M_t._M_impl._0_4_;
        auVar34._4_4_ = fVar31 * (float)((ulong)uVar60 >> 0x20) + edgeVerts._M_t._M_impl._4_4_;
        auVar34._8_4_ = fVar31 * 0.0 + 0.0;
        auVar34._12_4_ = fVar31 * 0.0 + 0.0;
        edgeVerts._M_t._M_impl._0_8_ = vmovlps_avx(auVar34);
        edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             (_Rb_tree_color)
             (fVar31 * *(float *)((long)&((pRing.
                                           super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->
                                         super_Tuple3<pbrt::Point3,_float>).x + lVar26) +
             (float)edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
        fVar31 = sinf(fVar33);
        uVar27 = uVar27 + 1;
        uVar60 = *(undefined8 *)
                  ((long)pRing.
                         super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8);
        fVar33 = fVar31 * *(float *)((long)&((pRing.
                                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super_Tuple3<pbrt::Point3,_float>).x + lVar26);
        in_ZMM1 = ZEXT464((uint)fVar33);
        lVar26 = lVar26 + 0xc;
        auVar35._0_4_ =
             fVar31 * (float)uVar60 +
             SUB84(verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,0);
        auVar35._4_4_ =
             fVar31 * (float)((ulong)uVar60 >> 0x20) +
             (float)((ulong)verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x20);
        auVar35._8_4_ = fVar31 * 0.0 + 0.0;
        auVar35._12_4_ = fVar31 * 0.0 + 0.0;
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)vmovlps_avx(auVar35);
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ =
             fVar33 + verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish._0_4_;
        auVar53 = ZEXT464((uint)verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      }
    }
    else {
      lVar26 = (long)(int)(uVar8 - 1);
      VVar65 = Point3<float>::operator-
                         (pRing.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar26,
                          pRing.
                          super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      uVar60 = auVar61._0_8_;
      edgeVerts._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)VVar65.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar50._0_8_ = VVar65.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar50._8_56_ = auVar61;
      edgeVerts._M_t._M_impl._0_8_ = vmovlps_avx(auVar50._0_16_);
      if (uVar8 == 4) {
        PVar64 = Tuple3<pbrt::Point3,float>::operator*
                           (&(pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_Tuple3<pbrt::Point3,_float>,-1);
        uVar56 = uVar60;
        PVar66 = Tuple3<pbrt::Point3,float>::operator*
                           (&pRing.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].
                             super_Tuple3<pbrt::Point3,_float>,2);
        uVar57 = uVar56;
        PVar67 = Tuple3<pbrt::Point3,float>::operator*
                           (&pRing.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].
                             super_Tuple3<pbrt::Point3,_float>,2);
        uVar58 = uVar57;
        PVar68 = Tuple3<pbrt::Point3,float>::operator*
                           (&pRing.
                             super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].
                             super_Tuple3<pbrt::Point3,_float>,-1);
        uVar59 = uVar58;
        PVar69 = Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,_float> *)pSVar15,-2);
        fVar33 = PVar66.super_Tuple3<pbrt::Point3,_float>.z +
                 PVar64.super_Tuple3<pbrt::Point3,_float>.z +
                 PVar67.super_Tuple3<pbrt::Point3,_float>.z +
                 PVar68.super_Tuple3<pbrt::Point3,_float>.z +
                 PVar69.super_Tuple3<pbrt::Point3,_float>.z;
        local_168 = PVar66.super_Tuple3<pbrt::Point3,_float>.x;
        fStack_164 = PVar66.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_160 = (float)uVar56;
        fStack_15c = (float)((ulong)uVar56 >> 0x20);
        local_2a8 = PVar64.super_Tuple3<pbrt::Point3,_float>.x;
        fStack_2a4 = PVar64.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_2a0 = (float)uVar60;
        fStack_29c = (float)((ulong)uVar60 >> 0x20);
        local_a8 = PVar67.super_Tuple3<pbrt::Point3,_float>.x;
        fStack_a4 = PVar67.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_a0 = (float)uVar57;
        fStack_9c = (float)((ulong)uVar57 >> 0x20);
        local_b8 = PVar68.super_Tuple3<pbrt::Point3,_float>.x;
        fStack_b4 = PVar68.super_Tuple3<pbrt::Point3,_float>.y;
        fStack_b0 = (float)uVar58;
        fStack_ac = (float)((ulong)uVar58 >> 0x20);
        auVar36._0_4_ =
             local_168 + local_2a8 + local_a8 + local_b8 +
             PVar69.super_Tuple3<pbrt::Point3,_float>.x;
        auVar36._4_4_ =
             fStack_164 + fStack_2a4 + fStack_a4 + fStack_b4 +
             PVar69.super_Tuple3<pbrt::Point3,_float>.y;
        auVar36._8_4_ = fStack_160 + fStack_2a0 + fStack_a0 + fStack_b0 + (float)uVar59;
        auVar36._12_4_ =
             fStack_15c + fStack_29c + fStack_9c + fStack_ac + (float)((ulong)uVar59 >> 0x20);
LAB_002e0b1f:
        in_ZMM1 = ZEXT464((uint)fVar33);
        auVar61 = ZEXT856(auVar36._8_8_);
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)vmovlps_avx(auVar36);
      }
      else if (uVar8 == 3) {
        VVar65 = Point3<float>::operator-
                           (pRing.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1,&pSVar15->p);
        in_ZMM1._0_4_ = VVar65.super_Tuple3<pbrt::Vector3,_float>.z;
        in_ZMM1._4_60_ = auVar62;
        auVar54._0_8_ = VVar65.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar54._8_56_ = auVar61;
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)vmovlps_avx(auVar54._0_16_);
      }
      else {
        if (uVar8 == 2) {
          PVar64 = Tuple3<pbrt::Point3,float>::operator+
                             (&(pRing.
                                super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                               super_Tuple3<pbrt::Point3,_float>,
                              pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1);
          auVar51._0_8_ = PVar64.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar51._8_56_ = auVar61;
          PVar66 = Tuple3<pbrt::Point3,float>::operator*((Tuple3<pbrt::Point3,_float> *)pSVar15,2);
          auVar52._0_8_ = PVar66.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar52._8_56_ = auVar61;
          auVar36 = vsubps_avx(auVar51._0_16_,auVar52._0_16_);
          fVar33 = PVar64.super_Tuple3<pbrt::Point3,_float>.z -
                   PVar66.super_Tuple3<pbrt::Point3,_float>.z;
          goto LAB_002e0b1f;
        }
        __x = 3.1415927 / (float)(int)(uVar8 - 1);
        fVar32 = sinf(__x);
        fVar33 = extraout_XMM0_Dc;
        fVar31 = extraout_XMM0_Dd;
        PVar64 = Tuple3<pbrt::Point3,float>::operator+
                           (&(pRing.
                              super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super_Tuple3<pbrt::Point3,_float>,
                            pRing.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar26);
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = fVar32 * PVar64.super_Tuple3<pbrt::Point3,_float>.z;
        auVar37._0_4_ = fVar32 * PVar64.super_Tuple3<pbrt::Point3,_float>.x;
        auVar37._4_4_ = fVar32 * PVar64.super_Tuple3<pbrt::Point3,_float>.y;
        auVar37._8_4_ = fVar32 * fVar33;
        auVar37._12_4_ = fVar32 * fVar31;
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)vmovlps_avx(auVar37);
        lVar23 = 0xc;
        lVar17 = 1;
        while (lVar17 < lVar26) {
          auVar55._0_4_ = cosf(__x);
          auVar55._4_60_ = extraout_var;
          auVar34 = vfmadd132ss_fma(auVar55._0_16_,SUB6416(ZEXT464(0xc0000000),0),
                                    ZEXT416(0x40000000));
          fVar33 = sinf((float)(int)lVar17 * __x);
          uVar60 = 0;
          PVar64 = Tuple3<pbrt::Point3,float>::operator*
                             ((Tuple3<pbrt::Point3,float> *)
                              ((long)&((pRing.
                                        super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_Tuple3<pbrt::Point3,_float>).x + lVar23),
                              fVar33 * auVar34._0_4_);
          lVar17 = lVar17 + 1;
          lVar23 = lVar23 + 0xc;
          auVar37._0_4_ =
               PVar64.super_Tuple3<pbrt::Point3,_float>.x +
               SUB84(verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,0);
          auVar37._4_4_ =
               PVar64.super_Tuple3<pbrt::Point3,_float>.y +
               (float)((ulong)verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 0x20);
          auVar37._8_4_ = (float)uVar60 + 0.0;
          auVar37._12_4_ = (float)((ulong)uVar60 >> 0x20) + 0.0;
          verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)vmovlps_avx(auVar37);
          verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ =
               PVar64.super_Tuple3<pbrt::Point3,_float>.z +
               verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish._0_4_;
        }
        auVar38._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
        auVar38._8_4_ = auVar37._8_4_ ^ 0x80000000;
        auVar38._12_4_ = auVar37._12_4_ ^ 0x80000000;
        auVar61 = ZEXT856(auVar38._8_8_);
        in_ZMM1 = ZEXT1664(CONCAT412(0x80000000,
                                     CONCAT48(0x80000000,
                                              CONCAT44(0x80000000,
                                                       -verts_1.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish._0_4_)))
                          );
        verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)vmovlps_avx(auVar38);
      }
      verts_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = in_ZMM1._0_4_;
    }
    auVar62 = in_ZMM1._4_60_;
    VVar65 = Cross<float>((Vector3<float> *)&edgeVerts,(Vector3<float> *)&verts_1);
    in_ZMM1._0_4_ = VVar65.super_Tuple3<pbrt::Vector3,_float>.z;
    in_ZMM1._4_60_ = auVar62;
    auVar49._0_8_ = VVar65.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar49._8_56_ = auVar61;
    vert = (SDVertex *)vmovlps_avx(auVar49._0_16_);
    pVStack_230 = (pointer)CONCAT44(pVStack_230._4_4_,in_ZMM1._0_4_);
    std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>::
    emplace_back<pbrt::Normal3<float>>
              ((vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>> *)&Ns,
               (Normal3<float> *)&vert);
    ppSVar22 = ppSVar22 + 1;
  } while( true );
}

Assistant:

TriangleMesh *LoopSubdivide(const Transform *renderFromObject, bool reverseOrientation,
                            int nLevels, pstd::span<const int> vertexIndices,
                            pstd::span<const Point3f> p, Allocator alloc) {
    std::vector<SDVertex *> vertices;
    std::vector<SDFace *> faces;
    // Allocate _LoopSubdiv_ vertices and faces
    std::unique_ptr<SDVertex[]> verts = std::make_unique<SDVertex[]>(p.size());
    for (int i = 0; i < p.size(); ++i) {
        verts[i] = SDVertex(p[i]);
        vertices.push_back(&verts[i]);
    }
    size_t nFaces = vertexIndices.size() / 3;
    std::unique_ptr<SDFace[]> fs = std::make_unique<SDFace[]>(nFaces);
    for (int i = 0; i < nFaces; ++i)
        faces.push_back(&fs[i]);

    // Set face to vertex pointers
    const int *vp = vertexIndices.data();
    for (size_t i = 0; i < nFaces; ++i, vp += 3) {
        SDFace *f = faces[i];
        for (int j = 0; j < 3; ++j) {
            SDVertex *v = vertices[vp[j]];
            f->v[j] = v;
            v->startFace = f;
        }
    }

    // Set neighbor pointers in _faces_
    std::set<SDEdge> edges;
    for (int i = 0; i < nFaces; ++i) {
        SDFace *f = faces[i];
        for (int edgeNum = 0; edgeNum < 3; ++edgeNum) {
            // Update neighbor pointer for _edgeNum_
            int v0 = edgeNum, v1 = NEXT(edgeNum);
            SDEdge e(f->v[v0], f->v[v1]);
            if (edges.find(e) == edges.end()) {
                // Handle new edge
                e.f[0] = f;
                e.f0edgeNum = edgeNum;
                edges.insert(e);
            } else {
                // Handle previously seen edge
                e = *edges.find(e);
                e.f[0]->f[e.f0edgeNum] = f;
                f->f[edgeNum] = e.f[0];
                edges.erase(e);
            }
        }
    }

    // Finish vertex initialization
    for (size_t i = 0; i < p.size(); ++i) {
        SDVertex *v = vertices[i];
        SDFace *f = v->startFace;
        do {
            f = f->nextFace(v);
        } while ((f != nullptr) && f != v->startFace);
        v->boundary = (f == nullptr);
        if (!v->boundary && v->valence() == 6)
            v->regular = true;
        else if (v->boundary && v->valence() == 4)
            v->regular = true;
        else
            v->regular = false;
    }

    // Refine _LoopSubdiv_ into triangles
    std::vector<SDFace *> f = faces;
    std::vector<SDVertex *> v = vertices;
    pstd::pmr::monotonic_buffer_resource resource;
    Allocator vertexFaceAllocator(&resource);

    for (int i = 0; i < nLevels; ++i) {
        // Update _f_ and _v_ for next level of subdivision
        std::vector<SDFace *> newFaces;
        std::vector<SDVertex *> newVertices;

        // Allocate next level of children in mesh tree
        for (SDVertex *vertex : v) {
            vertex->child = vertexFaceAllocator.new_object<SDVertex>();
            vertex->child->regular = vertex->regular;
            vertex->child->boundary = vertex->boundary;
            newVertices.push_back(vertex->child);
        }
        for (SDFace *face : f) {
            for (int k = 0; k < 4; ++k) {
                face->children[k] = vertexFaceAllocator.new_object<SDFace>();
                newFaces.push_back(face->children[k]);
            }
        }

        // Update vertex positions and create new edge vertices

        // Update vertex positions for even vertices
        for (SDVertex *vertex : v) {
            if (!vertex->boundary) {
                // Apply one-ring rule for even vertex
                if (vertex->regular)
                    vertex->child->p = weightOneRing(vertex, 1.f / 16.f);
                else
                    vertex->child->p = weightOneRing(vertex, beta(vertex->valence()));
            } else {
                // Apply boundary rule for even vertex
                vertex->child->p = weightBoundary(vertex, 1.f / 8.f);
            }
        }

        // Compute new odd edge vertices
        std::map<SDEdge, SDVertex *> edgeVerts;
        for (SDFace *face : f) {
            for (int k = 0; k < 3; ++k) {
                // Compute odd vertex on _k_th edge
                SDEdge edge(face->v[k], face->v[NEXT(k)]);
                SDVertex *vert = edgeVerts[edge];
                if (vert == nullptr) {
                    // Create and initialize new odd vertex
                    vert = vertexFaceAllocator.new_object<SDVertex>();
                    newVertices.push_back(vert);
                    vert->regular = true;
                    vert->boundary = (face->f[k] == nullptr);
                    vert->startFace = face->children[3];

                    // Apply edge rules to compute new vertex position
                    if (vert->boundary) {
                        vert->p = 0.5f * edge.v[0]->p;
                        vert->p += 0.5f * edge.v[1]->p;
                    } else {
                        vert->p = 3.f / 8.f * edge.v[0]->p;
                        vert->p += 3.f / 8.f * edge.v[1]->p;
                        vert->p += 1.f / 8.f * face->otherVert(edge.v[0], edge.v[1])->p;
                        vert->p +=
                            1.f / 8.f * face->f[k]->otherVert(edge.v[0], edge.v[1])->p;
                    }
                    edgeVerts[edge] = vert;
                }
            }
        }

        // Update new mesh topology

        // Update even vertex face pointers
        for (SDVertex *vertex : v) {
            int vertNum = vertex->startFace->vnum(vertex);
            vertex->child->startFace = vertex->startFace->children[vertNum];
        }

        // Update face neighbor pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update children _f_ pointers for siblings
                face->children[3]->f[j] = face->children[NEXT(j)];
                face->children[j]->f[NEXT(j)] = face->children[3];

                // Update children _f_ pointers for neighbor children
                SDFace *f2 = face->f[j];
                face->children[j]->f[j] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
                f2 = face->f[PREV(j)];
                face->children[j]->f[PREV(j)] =
                    f2 != nullptr ? f2->children[f2->vnum(face->v[j])] : nullptr;
            }
        }

        // Update face vertex pointers
        for (SDFace *face : f) {
            for (int j = 0; j < 3; ++j) {
                // Update child vertex pointer to new even vertex
                face->children[j]->v[j] = face->v[j]->child;

                // Update child vertex pointer to new odd vertex
                SDVertex *vert = edgeVerts[SDEdge(face->v[j], face->v[NEXT(j)])];
                face->children[j]->v[NEXT(j)] = vert;
                face->children[NEXT(j)]->v[j] = vert;
                face->children[3]->v[j] = vert;
            }
        }

        // Prepare for next level of subdivision
        f = newFaces;
        v = newVertices;
    }

    // Push vertices to limit surface
    std::vector<Point3f> pLimit(v.size());
    for (size_t i = 0; i < v.size(); ++i) {
        if (v[i]->boundary)
            pLimit[i] = weightBoundary(v[i], 1.f / 5.f);
        else
            pLimit[i] = weightOneRing(v[i], loopGamma(v[i]->valence()));
    }
    for (size_t i = 0; i < v.size(); ++i)
        v[i]->p = pLimit[i];

    // Compute vertex tangents on limit surface
    std::vector<Normal3f> Ns;
    Ns.reserve(v.size());
    std::vector<Point3f> pRing(16, Point3f());
    for (SDVertex *vertex : v) {
        Vector3f S(0, 0, 0), T(0, 0, 0);
        int valence = vertex->valence();
        if (valence > (int)pRing.size())
            pRing.resize(valence);
        vertex->oneRing(&pRing[0]);
        if (!vertex->boundary) {
            // Compute tangents of interior face
            for (int j = 0; j < valence; ++j) {
                S += std::cos(2 * Pi * j / valence) * Vector3f(pRing[j]);
                T += std::sin(2 * Pi * j / valence) * Vector3f(pRing[j]);
            }
        } else {
            // Compute tangents of boundary face
            S = pRing[valence - 1] - pRing[0];
            if (valence == 2)
                T = Vector3f(pRing[0] + pRing[1] - 2 * vertex->p);
            else if (valence == 3)
                T = pRing[1] - vertex->p;
            else if (valence == 4)  // regular
                T = Vector3f(-1 * pRing[0] + 2 * pRing[1] + 2 * pRing[2] + -1 * pRing[3] +
                             -2 * vertex->p);
            else {
                Float theta = Pi / float(valence - 1);
                T = Vector3f(std::sin(theta) * (pRing[0] + pRing[valence - 1]));
                for (int k = 1; k < valence - 1; ++k) {
                    Float wt = (2 * std::cos(theta) - 2) * std::sin((k)*theta);
                    T += Vector3f(wt * pRing[k]);
                }
                T = -T;
            }
        }
        Ns.push_back(Normal3f(Cross(S, T)));
    }

    // Create triangle mesh from subdivision mesh
    {
        size_t ntris = f.size();
        std::vector<int> verts(3 * ntris);
        int *vp = verts.data();
        size_t totVerts = v.size();
        std::map<SDVertex *, int> usedVerts;
        for (size_t i = 0; i < totVerts; ++i)
            usedVerts[v[i]] = i;
        for (size_t i = 0; i < ntris; ++i) {
            for (int j = 0; j < 3; ++j) {
                *vp = usedVerts[f[i]->v[j]];
                ++vp;
            }
        }
        return alloc.new_object<TriangleMesh>(*renderFromObject, reverseOrientation,
                                              verts, pLimit, std::vector<Vector3f>(), Ns,
                                              std::vector<Point2f>(), std::vector<int>());
    }
}